

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_getFrameHeader_advanced
                 (ZSTD_frameHeader *zfhPtr,void *src,size_t srcSize,ZSTD_format_e format)

{
  byte bVar1;
  U16 UVar2;
  U32 UVar3;
  uint uVar4;
  uint uVar5;
  ZSTD_format_e in_ECX;
  ulong in_RDX;
  void *in_RSI;
  ulong *in_RDI;
  U32 windowLog;
  BYTE wlByte;
  U64 frameContentSize;
  U32 dictID;
  U64 windowSize;
  U32 fcsID;
  U32 singleSegment;
  U32 checksumFlag;
  U32 dictIDSizeCode;
  size_t pos;
  BYTE fhdByte;
  size_t fhsize;
  uchar hbuf [4];
  size_t toCopy;
  size_t minInputSize;
  BYTE *ip;
  undefined4 in_stack_ffffffffffffff48;
  U32 in_stack_ffffffffffffff4c;
  void *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff68;
  ZSTD_format_e format_00;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  void *in_stack_ffffffffffffff78;
  U64 UVar6;
  uint local_7c;
  ulong local_78;
  size_t local_60;
  undefined1 local_44 [4];
  size_t local_40;
  size_t local_38;
  void *local_30;
  ZSTD_format_e local_24;
  ulong local_20;
  void *local_18;
  ulong *local_10;
  size_t local_8;
  
  format_00 = (ZSTD_format_e)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_30 = in_RSI;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_38 = ZSTD_startingInputLength(in_ECX);
  if ((local_20 == 0) || (local_18 != (void *)0x0)) {
    if (local_20 < local_38) {
      if ((local_20 != 0) && (local_24 != ZSTD_f_zstd1_magicless)) {
        if (4 < local_20) {
          local_20 = 4;
        }
        local_40 = local_20;
        MEM_writeLE32(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        memcpy(local_44,local_18,local_40);
        UVar3 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        if (UVar3 != 0xfd2fb528) {
          MEM_writeLE32(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          memcpy(local_44,local_18,local_40);
          UVar3 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                              );
          if ((UVar3 & 0xfffffff0) != 0x184d2a50) {
            return 0xfffffffffffffff6;
          }
        }
      }
      local_8 = local_38;
    }
    else {
      memset(local_10,0,0x30);
      if ((local_24 == ZSTD_f_zstd1_magicless) ||
         (UVar3 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                              ), UVar3 == 0xfd2fb528)) {
        local_8 = ZSTD_frameHeaderSize_internal
                            (in_stack_ffffffffffffff78,
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),format_00
                            );
        if (local_8 <= local_20) {
          *(int *)(local_10 + 3) = (int)local_8;
          bVar1 = *(byte *)((long)local_30 + (local_38 - 1));
          local_60 = local_38;
          uVar4 = (int)(uint)bVar1 >> 5 & 1;
          local_78 = 0;
          local_7c = 0;
          UVar6 = 0xffffffffffffffff;
          if ((bVar1 & 8) == 0) {
            if (uVar4 == 0) {
              local_60 = local_38 + 1;
              uVar5 = ((int)(uint)*(byte *)((long)local_30 + local_38) >> 3) + 10;
              if (0x1f < uVar5) {
                return 0xfffffffffffffff0;
              }
              local_78 = 1L << (sbyte)uVar5;
              local_78 = (local_78 >> 3) * (long)(int)(*(byte *)((long)local_30 + local_38) & 7) +
                         local_78;
            }
            switch(bVar1 & 3) {
            default:
              break;
            case 1:
              local_7c = (uint)*(byte *)((long)local_30 + local_60);
              local_60 = local_60 + 1;
              break;
            case 2:
              UVar2 = MEM_readLE16((void *)CONCAT44(in_stack_ffffffffffffff4c,
                                                    in_stack_ffffffffffffff48));
              local_7c = (uint)UVar2;
              local_60 = local_60 + 2;
              break;
            case 3:
              local_7c = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff4c,
                                                       in_stack_ffffffffffffff48));
              local_60 = local_60 + 4;
            }
            switch((int)(uint)bVar1 >> 6) {
            default:
              if (uVar4 != 0) {
                UVar6 = (U64)*(byte *)((long)local_30 + local_60);
              }
              break;
            case 1:
              UVar2 = MEM_readLE16((void *)CONCAT44(in_stack_ffffffffffffff4c,
                                                    in_stack_ffffffffffffff48));
              UVar6 = (U64)(int)(UVar2 + 0x100);
              break;
            case 2:
              UVar3 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff4c,
                                                    in_stack_ffffffffffffff48));
              UVar6 = (U64)UVar3;
              break;
            case 3:
              UVar6 = MEM_readLE64((void *)CONCAT44(in_stack_ffffffffffffff4c,
                                                    in_stack_ffffffffffffff48));
            }
            if (uVar4 != 0) {
              local_78 = UVar6;
            }
            *(undefined4 *)((long)local_10 + 0x14) = 0;
            *local_10 = UVar6;
            local_10[1] = local_78;
            if (0x1ffff < local_78) {
              local_78 = 0x20000;
            }
            *(int *)(local_10 + 2) = (int)local_78;
            *(uint *)((long)local_10 + 0x1c) = local_7c;
            *(uint *)(local_10 + 4) = (int)(uint)bVar1 >> 2 & 1;
            local_8 = 0;
          }
          else {
            local_8 = 0xfffffffffffffff2;
          }
        }
      }
      else {
        UVar3 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        if ((UVar3 & 0xfffffff0) == 0x184d2a50) {
          if (local_20 < 8) {
            local_8 = 8;
          }
          else {
            memset(local_10,0,0x30);
            UVar3 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff4c,
                                                  in_stack_ffffffffffffff48));
            *local_10 = (ulong)UVar3;
            *(undefined4 *)((long)local_10 + 0x14) = 1;
            local_8 = 0;
          }
        }
        else {
          local_8 = 0xfffffffffffffff6;
        }
      }
    }
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t ZSTD_getFrameHeader_advanced(ZSTD_frameHeader* zfhPtr, const void* src, size_t srcSize, ZSTD_format_e format)
{
    const BYTE* ip = (const BYTE*)src;
    size_t const minInputSize = ZSTD_startingInputLength(format);

    DEBUGLOG(5, "ZSTD_getFrameHeader_advanced: minInputSize = %zu, srcSize = %zu", minInputSize, srcSize);

    if (srcSize > 0) {
        /* note : technically could be considered an assert(), since it's an invalid entry */
        RETURN_ERROR_IF(src==NULL, GENERIC, "invalid parameter : src==NULL, but srcSize>0");
    }
    if (srcSize < minInputSize) {
        if (srcSize > 0 && format != ZSTD_f_zstd1_magicless) {
            /* when receiving less than @minInputSize bytes,
             * control these bytes at least correspond to a supported magic number
             * in order to error out early if they don't.
            **/
            size_t const toCopy = MIN(4, srcSize);
            unsigned char hbuf[4]; MEM_writeLE32(hbuf, ZSTD_MAGICNUMBER);
            assert(src != NULL);
            ZSTD_memcpy(hbuf, src, toCopy);
            if ( MEM_readLE32(hbuf) != ZSTD_MAGICNUMBER ) {
                /* not a zstd frame : let's check if it's a skippable frame */
                MEM_writeLE32(hbuf, ZSTD_MAGIC_SKIPPABLE_START);
                ZSTD_memcpy(hbuf, src, toCopy);
                if ((MEM_readLE32(hbuf) & ZSTD_MAGIC_SKIPPABLE_MASK) != ZSTD_MAGIC_SKIPPABLE_START) {
                    RETURN_ERROR(prefix_unknown,
                                "first bytes don't correspond to any supported magic number");
        }   }   }
        return minInputSize;
    }

    ZSTD_memset(zfhPtr, 0, sizeof(*zfhPtr));   /* not strictly necessary, but static analyzers may not understand that zfhPtr will be read only if return value is zero, since they are 2 different signals */
    if ( (format != ZSTD_f_zstd1_magicless)
      && (MEM_readLE32(src) != ZSTD_MAGICNUMBER) ) {
        if ((MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
            /* skippable frame */
            if (srcSize < ZSTD_SKIPPABLEHEADERSIZE)
                return ZSTD_SKIPPABLEHEADERSIZE; /* magic number + frame length */
            ZSTD_memset(zfhPtr, 0, sizeof(*zfhPtr));
            zfhPtr->frameContentSize = MEM_readLE32((const char *)src + ZSTD_FRAMEIDSIZE);
            zfhPtr->frameType = ZSTD_skippableFrame;
            return 0;
        }
        RETURN_ERROR(prefix_unknown, "");
    }

    /* ensure there is enough `srcSize` to fully read/decode frame header */
    {   size_t const fhsize = ZSTD_frameHeaderSize_internal(src, srcSize, format);
        if (srcSize < fhsize) return fhsize;
        zfhPtr->headerSize = (U32)fhsize;
    }

    {   BYTE const fhdByte = ip[minInputSize-1];
        size_t pos = minInputSize;
        U32 const dictIDSizeCode = fhdByte&3;
        U32 const checksumFlag = (fhdByte>>2)&1;
        U32 const singleSegment = (fhdByte>>5)&1;
        U32 const fcsID = fhdByte>>6;
        U64 windowSize = 0;
        U32 dictID = 0;
        U64 frameContentSize = ZSTD_CONTENTSIZE_UNKNOWN;
        RETURN_ERROR_IF((fhdByte & 0x08) != 0, frameParameter_unsupported,
                        "reserved bits, must be zero");

        if (!singleSegment) {
            BYTE const wlByte = ip[pos++];
            U32 const windowLog = (wlByte >> 3) + ZSTD_WINDOWLOG_ABSOLUTEMIN;
            RETURN_ERROR_IF(windowLog > ZSTD_WINDOWLOG_MAX, frameParameter_windowTooLarge, "");
            windowSize = (1ULL << windowLog);
            windowSize += (windowSize >> 3) * (wlByte&7);
        }
        switch(dictIDSizeCode)
        {
            default:
                assert(0);  /* impossible */
                ZSTD_FALLTHROUGH;
            case 0 : break;
            case 1 : dictID = ip[pos]; pos++; break;
            case 2 : dictID = MEM_readLE16(ip+pos); pos+=2; break;
            case 3 : dictID = MEM_readLE32(ip+pos); pos+=4; break;
        }
        switch(fcsID)
        {
            default:
                assert(0);  /* impossible */
                ZSTD_FALLTHROUGH;
            case 0 : if (singleSegment) frameContentSize = ip[pos]; break;
            case 1 : frameContentSize = MEM_readLE16(ip+pos)+256; break;
            case 2 : frameContentSize = MEM_readLE32(ip+pos); break;
            case 3 : frameContentSize = MEM_readLE64(ip+pos); break;
        }
        if (singleSegment) windowSize = frameContentSize;

        zfhPtr->frameType = ZSTD_frame;
        zfhPtr->frameContentSize = frameContentSize;
        zfhPtr->windowSize = windowSize;
        zfhPtr->blockSizeMax = (unsigned) MIN(windowSize, ZSTD_BLOCKSIZE_MAX);
        zfhPtr->dictID = dictID;
        zfhPtr->checksumFlag = checksumFlag;
    }
    return 0;
}